

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O3

GMM_STATUS __thiscall
GmmLib::GmmGen9TextureCalc::FillTex1D
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  uint32_t UnitAlignment;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  anon_struct_8_44_94931171_for_Info aVar5;
  uint32_t NumSamples;
  GMM_STATUS GVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t CompressHeight;
  uint32_t CompressDepth;
  ulong local_50;
  GMM_PLATFORM_INFO *local_48;
  uint local_40;
  uint local_3c;
  uint32_t CompressWidth;
  uint8_t local_31;
  
  GVar6 = GMM_ERROR;
  if (pRestrictions != (__GMM_BUFFER_TYPE *)0x0 && pTexInfo != (GMM_TEXTURE_INFO *)0x0) {
    aVar5 = (anon_struct_8_44_94931171_for_Info)
            ((ulong)(pTexInfo->Flags).Info & 0xfffffff3fff7ffff | 0x80000);
    (pTexInfo->Flags).Info = aVar5;
    uVar7 = 0xffffffe3ffffffff;
    if (((uint)(((this->super_GmmTextureCalc).pGmmLibContext)->SkuTable).field_0 & 0x40) == 0) {
      uVar7 = 0xfffff7f3ffffffff;
    }
    (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)(uVar7 & (ulong)aVar5);
    local_48 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
    CompressWidth = pTexInfo->ArraySize;
    local_3c = CompressWidth + (CompressWidth == 0);
    local_50 = (ulong)pTexInfo->BitsPerPixel;
    UnitAlignment = (pTexInfo->Alignment).HAlign;
    local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
    GmmTextureCalc::GetCompressionBlockDimensions
              (&this->super_GmmTextureCalc,pTexInfo->Format,&local_40,&local_60,&local_5c);
    if ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) != 0) {
      GmmTextureCalc::FindMipTailStartLod(&this->super_GmmTextureCalc,pTexInfo);
    }
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
      uVar2 = 1;
    }
    else {
      uVar2 = (pTexInfo->MSAA).NumSamples;
    }
    _CompressHeight = pRestrictions;
    uVar2 = GmmTextureCalc::ExpandWidth
                      (&this->super_GmmTextureCalc,(uint32_t)pTexInfo->BaseWidth,UnitAlignment,uVar2
                      );
    if (((((ulong)(pTexInfo->Flags).Info & 0x106000000000) == 0) ||
        ((pTexInfo->Alignment).MipTailStartLod != 0)) && (pTexInfo->MaxLod != 0)) {
      uVar7 = 1;
      do {
        if ((((ulong)(pTexInfo->Flags).Info & 0x106000000000) != 0) &&
           ((uint32_t)uVar7 == (pTexInfo->Alignment).MipTailStartLod)) {
          uVar2 = uVar2 + local_48->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
          break;
        }
        uVar3 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x18])(this,pTexInfo,uVar7);
        if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
          NumSamples = 1;
        }
        else {
          NumSamples = (pTexInfo->MSAA).NumSamples;
        }
        uVar4 = GmmTextureCalc::ExpandWidth
                          (&this->super_GmmTextureCalc,uVar3,UnitAlignment,NumSamples);
        if (local_31 != '\0') {
          uVar4 = uVar4 / local_40;
        }
        uVar2 = uVar2 + uVar4;
        uVar4 = (uint32_t)uVar7 + 1;
        uVar7 = (ulong)uVar4;
      } while (uVar4 <= pTexInfo->MaxLod);
    }
    uVar3 = 0;
    if (1 < CompressWidth) {
      uVar3 = uVar2;
    }
    (pTexInfo->Alignment).QPitch = -UnitAlignment & (UnitAlignment - 1) + uVar3;
    pTexInfo->Pitch = 0;
    uVar7 = (ulong)local_3c * (ulong)(((uint)(local_50 >> 3) & 0x1fffffff) * uVar2) + 0xfff &
            0xfffffffffffff000;
    bVar1 = local_48->SurfaceMaxSize < (long)uVar7;
    if (!bVar1) {
      pTexInfo->Size = uVar7;
      Fill1DTexOffsetAddress(this,pTexInfo);
    }
    GVar6 = (GMM_STATUS)bVar1;
    uVar4 = (pTexInfo->Alignment).BaseAlignment;
    uVar8 = _CompressHeight->Alignment;
    if ((uVar4 != 0) && (uVar8 % uVar4 != 0)) {
      if (uVar4 % uVar8 == 0) {
        return GVar6;
      }
      uVar8 = uVar8 * uVar4;
    }
    (pTexInfo->Alignment).BaseAlignment = uVar8;
  }
  return GVar6;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen9TextureCalc::FillTex1D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   ArraySize, BitsPerPixel, HAlign, i, Width, MipWidth;
    int64_t    Size;
    GMM_STATUS Status = GMM_SUCCESS;
    uint8_t    Compressed;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);
    __GMM_ASSERT(pTexInfo->Flags.Info.Linear ||
                 pTexInfo->Flags.Info.TiledYf ||
                 GMM_IS_64KB_TILE(pTexInfo->Flags));

    pTexInfo->Flags.Info.Linear = 1;
    pTexInfo->Flags.Info.TiledW = 0;
    pTexInfo->Flags.Info.TiledX = 0;
    GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    ArraySize    = GFX_MAX(pTexInfo->ArraySize, 1);
    BitsPerPixel = pTexInfo->BitsPerPixel;
    HAlign       = pTexInfo->Alignment.HAlign;

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    if(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags))
    {
        FindMipTailStartLod(pTexInfo);
    }

    /////////////////////////////
    // Calculate Surface QPitch
    /////////////////////////////

    Width    = __GMM_EXPAND_WIDTH(this, GFX_ULONG_CAST(pTexInfo->BaseWidth), HAlign, pTexInfo);
    MipWidth = Width;

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Width is already aligned.
    }
    else
    {
        for(i = 1; i <= pTexInfo->MaxLod; i++)
        {
            uint32_t AlignedMipWidth;

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                Width += pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
                break;
            }
            else
            {
                MipWidth = GFX_ULONG_CAST(GmmTexGetMipWidth(pTexInfo, i));

                AlignedMipWidth = __GMM_EXPAND_WIDTH(this, MipWidth, HAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedMipWidth /= CompressWidth;
                }

                Width += AlignedMipWidth;
            }
        }
    }

    pTexInfo->Alignment.QPitch = GFX_ALIGN((ArraySize > 1) ? Width : 0, HAlign); // in pixels

    pTexInfo->Pitch = 0;

    ///////////////////////////
    // Calculate Surface Size
    ///////////////////////////

    Width *= BitsPerPixel >> 3;

    Size = GFX_ALIGN((uint64_t)Width * ArraySize, PAGE_SIZE);

    if(Size <= pPlatform->SurfaceMaxSize)
    {
        pTexInfo->Size = Size;

        Fill1DTexOffsetAddress(pTexInfo);
    }
    else
    {
        GMM_ASSERTDPF(0, "Surface too large!");
        Status = GMM_ERROR;
    }

    //////////////////////
    // Surface Alignment
    //////////////////////

    if(!pTexInfo->Alignment.BaseAlignment || __GMM_IS_ALIGN(pRestrictions->Alignment, pTexInfo->Alignment.BaseAlignment))
    {
        pTexInfo->Alignment.BaseAlignment = pRestrictions->Alignment;
    }
    else if(__GMM_IS_ALIGN(pTexInfo->Alignment.BaseAlignment, pRestrictions->Alignment))
    {
        // Do nothing: pTexInfo->Alignment.BaseAlignment is properly aligned
    }
    else
    {
        pTexInfo->Alignment.BaseAlignment = pTexInfo->Alignment.BaseAlignment * pRestrictions->Alignment;
        GMM_ASSERTDPF(0,
                      "Client requested alignment that is not properly aligned to HW requirements."
                      "Alignment is going to be much higher to match both client and HW requirements.\r\n");
    }

    GMM_DPF_EXIT;

    return (Status);
}